

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnpy.h
# Opt level: O0

vector<char,_std::allocator<char>_> *
cnpy::operator+=(vector<char,_std::allocator<char>_> *lhs,char rhs)

{
  undefined1 in_SIL;
  vector<char,_std::allocator<char>_> *in_RDI;
  char val;
  size_t byte;
  long lVar1;
  undefined7 in_stack_fffffffffffffff0;
  
  for (lVar1 = 0; lVar1 == 0; lVar1 = lVar1 + 1) {
    std::vector<char,_std::allocator<char>_>::push_back
              ((vector<char,_std::allocator<char>_> *)CONCAT17(in_SIL,in_stack_fffffffffffffff0),
               (value_type_conflict *)0x0);
  }
  return in_RDI;
}

Assistant:

std::vector<char>& operator+=(std::vector<char>& lhs, const T rhs) {
        //write in little endian
        for(size_t byte = 0; byte < sizeof(T); byte++) {
            char val = *((char*)&rhs+byte); 
            lhs.push_back(val);
        }
        return lhs;
    }